

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_plats.cpp
# Opt level: O2

void EV_StopPlat(int tag,bool remove)

{
  DThinker *pDVar1;
  DThinker *pDVar2;
  TThinkerIterator<DPlat> iterator;
  FThinkerIterator local_40;
  
  TThinkerIterator<DPlat>::TThinkerIterator((TThinkerIterator<DPlat> *)&local_40,0x80);
  pDVar1 = FThinkerIterator::Next(&local_40);
  while (pDVar2 = pDVar1, pDVar2 != (DThinker *)0x0) {
    pDVar1 = FThinkerIterator::Next(&local_40);
    if ((*(int *)&pDVar2[1].PrevThinker != 3) &&
       (*(int *)((long)&pDVar2[2].super_DObject._vptr_DObject + 4) == tag)) {
      if (remove) {
        (*(pDVar2->super_DObject)._vptr_DObject[4])(pDVar2);
      }
      else {
        *(int *)((long)&pDVar2[1].PrevThinker + 4) = *(int *)&pDVar2[1].PrevThinker;
        *(undefined4 *)&pDVar2[1].PrevThinker = 3;
      }
    }
  }
  return;
}

Assistant:

void EV_StopPlat (int tag, bool remove)
{
	DPlat *scan;
	TThinkerIterator<DPlat> iterator;

	scan = iterator.Next();
	while (scan != nullptr)
	{
		DPlat *next = iterator.Next();
		if (scan->m_Status != DPlat::in_stasis && scan->m_Tag == tag)
		{
			if (!remove) scan->Stop();
			else scan->Destroy();
		}
		scan = next;
	}
}